

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.h
# Opt level: O0

void __thiscall Group::Group(Group *this)

{
  int iVar1;
  Group *this_local;
  
  iVar1 = counter + 1;
  this->id = counter;
  counter = iVar1;
  std::__cxx11::string::string((string *)&this->name);
  std::vector<Subject,_std::allocator<Subject>_>::vector(&this->subjects);
  return;
}

Assistant:

Group() : id(counter++) {}